

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall Liby::TimerQueue::handleTimeoutEvents(TimerQueue *this)

{
  BinaryHeap<Liby::WeakTimerHolder> *this_00;
  weak_ptr<Liby::Timer> *pwVar1;
  int iVar2;
  pointer pWVar3;
  bool bVar4;
  Logger *this_01;
  double __x;
  shared_ptr<Liby::Timer> TimerPtr;
  __weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> local_50;
  Timestamp now;
  
  if (this->poller_ == (Poller *)0x0) {
    __assert_fail("poller_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TimerQueue.cpp"
                  ,0x53,"void Liby::TimerQueue::handleTimeoutEvents()");
  }
  if ((this->queue_).size_ != 0) {
    this_00 = &this->queue_;
    Timestamp::now();
    while (this_00->size_ != 0) {
      pWVar3 = (this->queue_).heap.
               super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar4 = operator<(&now,&pWVar3[1].timer_.timeout_);
      if (bVar4) {
        if (this_00->size_ == 0) {
          return;
        }
        updateTimerfd(this,&(this->queue_).heap.
                            super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].timer_.timeout_);
        return;
      }
      pwVar1 = &pWVar3[1].weakTimerPtr_;
      std::__weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                ((__weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)&TimerPtr,
                 &pwVar1->super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>);
      if (TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                   &TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
      }
      else {
        iVar2 = (TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count;
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                   &TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        if (iVar2 != 0) {
          std::__weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                    (&local_50,&pwVar1->super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>);
          std::__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)&TimerPtr,&local_50);
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_50._M_refcount);
          std::function<void_()>::operator()
                    (&(TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->handler_);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      this_01 = Logger::getLogger();
      Logger::log(this_01,__x);
      BinaryHeap<Liby::WeakTimerHolder>::delete_min(this_00);
    }
  }
  return;
}

Assistant:

void TimerQueue::handleTimeoutEvents() {
    assert(poller_);
    if (queue_.empty()) {
        return;
    }

    auto now = Timestamp::now();
    while (!queue_.empty()) {
        WeakTimerHolder &weak_holder = queue_.find_min();
        Timer &minTimer = weak_holder.getTimer();
        if (now < minTimer.timeout()) {
            break;
        }

        if (!weak_holder.getWeakTimerPtr().expired()) {
            std::shared_ptr<Timer> TimerPtr =
                weak_holder.getWeakTimerPtr().lock();
            TimerPtr->runHandler();
        }
        verbose("delete timer id = %lu\n", minTimer.id());
        queue_.delete_min();
    }
    if (!queue_.empty()) {
        updateTimerfd(queue_.find_min().getTimer().timeout());
    }
}